

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdAddSignWithPrivkeySimple
              (void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,int hash_type,
              char *pubkey,char *privkey,int64_t value_satoshi,int sighash_type,
              bool sighash_anyone_can_pay,bool has_grind_r,char **tx_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  bool bVar3;
  AddressType address_type;
  char *pcVar4;
  CfdException *pCVar5;
  allocator local_1ea;
  bool is_bitcoin;
  string local_1e8;
  Pubkey local_1c8;
  void *local_1b0;
  Privkey privkey_obj;
  TransactionContext tx;
  OutPoint outpoint;
  string privkey_str;
  SigHashType sighashtype;
  Amount value;
  SigHashType local_48;
  SigHashType local_3c;
  
  local_1b0 = handle;
  cfd::Initialize();
  bVar3 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar3) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x63077b;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x726;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5342d7;
    cfd::core::logger::log<>((CfdSourceLocation *)&tx,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&tx.super_Transaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tx,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(txid);
  if (bVar3) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x63077b;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x72c;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5342d7;
    cfd::core::logger::log<>((CfdSourceLocation *)&tx,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&tx.super_Transaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tx,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(pubkey);
  if (bVar3) {
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x63077b;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x732;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5342d7;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&tx,kCfdLogLevelWarning,"pubkey is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&tx.super_Transaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tx,"Failed to parameter. pubkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar3 = cfd::capi::IsEmptyString(privkey);
  if (!bVar3) {
    if (tx_string != (char **)0x0) {
      address_type = cfd::capi::ConvertHashToAddressType(0);
      cfd::core::Amount::Amount(&value,value_satoshi);
      cfd::core::Privkey::Privkey(&privkey_obj);
      std::__cxx11::string::string((string *)&privkey_str,privkey,(allocator *)&tx);
      if (privkey_str._M_string_length == 0x40) {
        cfd::core::Privkey::Privkey((Privkey *)&tx,&privkey_str,kMainnet,true);
        cfd::core::ByteData::operator=(&privkey_obj.data_,(ByteData *)&tx);
      }
      else {
        cfd::api::KeyApi::GetPrivkeyFromWif
                  ((Privkey *)&tx,(KeyApi *)&outpoint,&privkey_str,(NetType *)0x0,(bool *)0x0);
        cfd::core::ByteData::operator=(&privkey_obj.data_,(ByteData *)&tx);
      }
      privkey_obj._24_8_ =
           tx.super_Transaction.vin_.
           super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction !=
          (_func_int **)0x0) {
        operator_delete(tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction,
                        (long)tx.super_Transaction.vin_.
                              super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
                              _M_impl.super__Vector_impl_data._M_start -
                        (long)tx.super_Transaction.super_AbstractTransaction.
                              _vptr_AbstractTransaction);
      }
      std::__cxx11::string::string((string *)&local_1e8,txid,(allocator *)&local_1c8);
      cfd::core::Txid::Txid((Txid *)&tx,&local_1e8);
      cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&tx,vout);
      tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
           (_func_int **)&PTR__Txid_0087c9b8;
      pvVar2 = (void *)CONCAT44(tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_.
                                _4_4_,tx.super_Transaction.super_AbstractTransaction.
                                      wally_tx_pointer_._0_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)tx.super_Transaction.vin_.
                                     super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2);
      }
      paVar1 = &local_1e8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      cfd::core::SigHashType::Create
                (&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
      is_bitcoin = false;
      cfd::capi::ConvertNetType(net_type,&is_bitcoin);
      if (is_bitcoin == true) {
        std::__cxx11::string::string((string *)&local_1e8,tx_hex_string,(allocator *)&local_1c8);
        cfd::TransactionContext::TransactionContext(&tx,&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::string((string *)&local_1e8,pubkey,&local_1ea);
        cfd::core::Pubkey::Pubkey(&local_1c8,&local_1e8);
        cfd::core::SigHashType::SigHashType(&local_3c,&sighashtype);
        cfd::TransactionContext::SignWithPrivkeySimple
                  (&tx,&outpoint,&local_1c8,&privkey_obj,&local_3c,&value,address_type,has_grind_r);
        if (local_1c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1c8.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c8.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_1e8,(AbstractTransaction *)&tx);
        pcVar4 = cfd::capi::CreateString(&local_1e8);
        *tx_string = pcVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        cfd::TransactionContext::~TransactionContext(&tx);
      }
      else {
        std::__cxx11::string::string((string *)&local_1e8,tx_hex_string,(allocator *)&local_1c8);
        cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                  ((ConfidentialTransactionContext *)&tx,&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::string((string *)&local_1e8,pubkey,&local_1ea);
        cfd::core::Pubkey::Pubkey(&local_1c8,&local_1e8);
        cfd::core::SigHashType::SigHashType(&local_48,&sighashtype);
        cfd::ConfidentialTransactionContext::SignWithPrivkeySimple
                  ((ConfidentialTransactionContext *)&tx,&outpoint,&local_1c8,&privkey_obj,&local_48
                   ,&value,address_type,has_grind_r);
        if (local_1c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1c8.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1c8.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c8.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_1e8,(AbstractTransaction *)&tx);
        pcVar4 = cfd::capi::CreateString(&local_1e8);
        *tx_string = pcVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
                  ((ConfidentialTransactionContext *)&tx);
      }
      outpoint.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0087c9b8;
      if (outpoint.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(outpoint.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)outpoint.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)outpoint.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)privkey_str._M_dataplus._M_p != &privkey_str.field_2) {
        operator_delete(privkey_str._M_dataplus._M_p,privkey_str.field_2._M_allocated_capacity + 1);
      }
      if (privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(privkey_obj.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)privkey_obj.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)privkey_obj.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return 0;
    }
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x63077b;
    tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x73e;
    tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5342d7;
    cfd::core::logger::log<>((CfdSourceLocation *)&tx,kCfdLogLevelWarning,"tx output is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&tx.super_Transaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&tx,"Failed to parameter. tx output is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tx);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x63077b;
  tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x738;
  tx.super_Transaction.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5342d7;
  cfd::core::logger::log<>((CfdSourceLocation *)&tx,kCfdLogLevelWarning,"privkey is null or empty.")
  ;
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&tx.super_Transaction.vin_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tx,"Failed to parameter. privkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&tx);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddSignWithPrivkeySimple(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* pubkey, const char* privkey,
    int64_t value_satoshi, int sighash_type, bool sighash_anyone_can_pay,
    bool has_grind_r, char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    Amount value = Amount(value_satoshi);

    Privkey privkey_obj;
    std::string privkey_str(privkey);
    if (privkey_str.length() == (Privkey::kPrivkeySize * 2)) {
      privkey_obj = Privkey(privkey_str);
    } else {
      KeyApi keyapi;
      privkey_obj = keyapi.GetPrivkeyFromWif(privkey_str);
    }

    OutPoint outpoint(Txid(txid), vout);
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      tx.SignWithPrivkeySimple(
          outpoint, Pubkey(pubkey), privkey_obj, sighashtype, value, addr_type,
          has_grind_r);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      tx.SignWithPrivkeySimple(
          outpoint, Pubkey(pubkey), privkey_obj, sighashtype, value, addr_type,
          has_grind_r);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}